

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alldiff.h
# Opt level: O0

void __thiscall
mp::
AllDiffConverter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
::ConvertCtxPos(AllDiffConverter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                *this,ItemType_conflict3 *alld,int param_3)

{
  initializer_list<double> __l;
  initializer_list<int> __l_00;
  BasicCStringRef<char> BVar1;
  ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>_> *pCVar2;
  bool bVar3;
  int iVar4;
  undefined8 uVar5;
  vector<int,_std::allocator<int>_> *v_00;
  size_type sVar6;
  const_reference pvVar7;
  reference pvVar8;
  FunctionalConstraint *in_RSI;
  Arguments *in_RDI;
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  NodeRange NVar12;
  size_t ivar;
  int v;
  double rhs;
  vector<int,_std::allocator<int>_> flags;
  vector<double,_std::allocator<double>_> coefs;
  int uba;
  int lba;
  double uba_dbl;
  double lba_dbl;
  Arguments *args;
  undefined4 in_stack_fffffffffffffb08;
  int in_stack_fffffffffffffb0c;
  NodeIndexRange in_stack_fffffffffffffb10;
  ValueNode *in_stack_fffffffffffffb18;
  allocator_type *in_stack_fffffffffffffb20;
  undefined1 *in_stack_fffffffffffffb28;
  undefined1 fSort;
  undefined4 in_stack_fffffffffffffb30;
  Var in_stack_fffffffffffffb34;
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *in_stack_fffffffffffffb38;
  AlgConRhs<_1> in_stack_fffffffffffffb40;
  undefined1 *puVar13;
  undefined4 uVar14;
  int in_stack_fffffffffffffb54;
  undefined4 uVar15;
  Error *in_stack_fffffffffffffb58;
  CStringRef in_stack_fffffffffffffb60;
  vector<double,_std::allocator<double>_> *c;
  LinTerms *in_stack_fffffffffffffb80;
  ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>_> *this_00;
  AlgConRhs<_1> local_438 [36];
  AlgConRhs<0> local_318;
  undefined1 local_30d [613];
  double local_a8;
  vector<int,_std::allocator<int>_> local_98;
  vector<double,_std::allocator<double>_> local_79;
  int local_58;
  int local_54;
  BasicCStringRef<char> local_50 [3];
  BasicCStringRef<char> local_38 [2];
  ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>_> *local_28;
  Arguments *local_20;
  FunctionalConstraint *local_10;
  
  local_10 = in_RSI;
  local_20 = CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::AllDiffId>
             ::GetArguments((CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::AllDiffId>
                             *)(in_RSI + 1));
  BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  ::GetMC((BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
           *)in_RDI);
  local_28 = (ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>_> *)
             FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
             ::lb_array<std::vector<int,std::allocator<int>>>
                       ((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                         *)in_stack_fffffffffffffb10,
                        (vector<int,_std::allocator<int>_> *)
                        CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08));
  BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  ::GetMC((BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
           *)in_RDI);
  local_38[1].data_ =
       (char *)FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
               ::ub_array<std::vector<int,std::allocator<int>>>
                         ((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                           *)in_stack_fffffffffffffb10,
                          (vector<int,_std::allocator<int>_> *)
                          CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08));
  this_00 = local_28;
  BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  ::GetMC((BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
           *)in_RDI);
  dVar9 = BasicFlatConverter::MinusInfty();
  BVar1.data_ = local_38[1].data_;
  if (dVar9 < (double)this_00) {
    BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
    ::GetMC((BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
             *)in_RDI);
    dVar9 = BasicFlatConverter::Infty();
    pCVar2 = local_28;
    if ((double)BVar1.data_ < dVar9) {
      iVar4 = std::numeric_limits<int>::min();
      BVar1.data_ = local_38[1].data_;
      if ((double)iVar4 <= (double)pCVar2) {
        iVar4 = std::numeric_limits<int>::max();
        if ((double)BVar1.data_ <= (double)iVar4) {
          dVar9 = round((double)local_28);
          local_54 = (int)dVar9;
          dVar9 = round((double)local_38[1].data_);
          local_58 = (int)dVar9;
          v_00 = (vector<int,_std::allocator<int>_> *)
                 std::vector<int,_std::allocator<int>_>::size(local_20);
          local_79.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._1_8_ = 0x3ff0000000000000;
          c = &local_79;
          std::allocator<double>::allocator((allocator<double> *)0x2bbd8a);
          std::vector<double,_std::allocator<double>_>::vector
                    ((vector<double,_std::allocator<double>_> *)
                     CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                     (size_type)in_stack_fffffffffffffb28,
                     (value_type_conflict *)in_stack_fffffffffffffb20,
                     (allocator_type *)in_stack_fffffffffffffb18);
          std::allocator<double>::~allocator((allocator<double> *)0x2bbdb8);
          std::vector<int,_std::allocator<int>_>::size(local_20);
          std::allocator<int>::allocator((allocator<int> *)0x2bbddc);
          std::vector<int,_std::allocator<int>_>::vector
                    ((vector<int,_std::allocator<int>_> *)
                     CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                     (size_type)in_stack_fffffffffffffb28,in_stack_fffffffffffffb20);
          std::allocator<int>::~allocator((allocator<int> *)0x2bbe02);
          local_a8 = 1.0;
          BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
          ::GetMC((BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                   *)in_RDI);
          FunctionalConstraint::GetResultVar(local_10);
          bVar3 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                  ::is_fixed((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                              *)in_stack_fffffffffffffb10,in_stack_fffffffffffffb0c);
          if (!bVar3) {
            sVar6 = std::vector<int,_std::allocator<int>_>::size(local_20);
            auVar10._8_4_ = (int)(sVar6 >> 0x20);
            auVar10._0_8_ = sVar6;
            auVar10._12_4_ = 0x45300000;
            local_30d._605_8_ =
                 (auVar10._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)sVar6) - 4503599627370496.0) + -1.0;
            std::vector<double,_std::allocator<double>_>::push_back
                      ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffb10,
                       (value_type_conflict *)
                       CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08));
            local_30d._601_4_ = FunctionalConstraint::GetResultVar(local_10);
            std::vector<int,_std::allocator<int>_>::push_back
                      ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffb10,
                       (value_type *)CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08));
            sVar6 = std::vector<int,_std::allocator<int>_>::size(local_20);
            auVar11._8_4_ = (int)(sVar6 >> 0x20);
            auVar11._0_8_ = sVar6;
            auVar11._12_4_ = 0x45300000;
            local_a8 = (auVar11._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)sVar6) - 4503599627370496.0);
          }
          NVar12.ir_ = in_stack_fffffffffffffb10;
          NVar12.pvn_ = in_stack_fffffffffffffb18;
          for (local_30d._597_4_ = local_54; local_30d._597_4_ != local_58 + 1;
              local_30d._597_4_ = local_30d._597_4_ + 1) {
            local_30d._589_8_ = 0;
            while( true ) {
              uVar14 = (undefined4)local_30d._589_8_;
              uVar15 = SUB84(local_30d._589_8_,4);
              sVar6 = std::vector<int,_std::allocator<int>_>::size(local_20);
              fSort = (undefined1)((ulong)in_stack_fffffffffffffb28 >> 0x38);
              if (sVar6 <= CONCAT44(uVar15,uVar14)) break;
              in_stack_fffffffffffffb40.rhs_ =
                   (double)BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                           ::GetMC((BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                                    *)in_RDI);
              local_30d._53_8_ = 0x3ff0000000000000;
              local_30d._61_8_ = local_30d + 0x35;
              local_30d._69_8_ = 1;
              puVar13 = local_30d + 0x34;
              std::allocator<double>::allocator((allocator<double> *)0x2bc025);
              __l._M_len._0_4_ = uVar14;
              __l._M_array = (iterator)puVar13;
              __l._M_len._4_4_ = uVar15;
              std::vector<double,_std::allocator<double>_>::vector
                        ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffb40.rhs_,
                         __l,(allocator_type *)in_stack_fffffffffffffb38);
              pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                                 (local_20,local_30d._589_8_);
              local_30d._1_4_ = *pvVar7;
              local_30d._5_8_ = local_30d + 1;
              local_30d._13_8_ = 1;
              in_stack_fffffffffffffb38 =
                   (FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                    *)local_30d;
              std::allocator<int>::allocator((allocator<int> *)0x2bc095);
              __l_00._M_len._0_4_ = uVar14;
              __l_00._M_array = (iterator)puVar13;
              __l_00._M_len._4_4_ = uVar15;
              std::vector<int,_std::allocator<int>_>::vector
                        ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffb40.rhs_,__l_00,
                         (allocator_type *)in_stack_fffffffffffffb38);
              LinTerms::LinTerms(in_stack_fffffffffffffb80,c,v_00);
              AlgConRhs<0>::AlgConRhs(&local_318,(double)(int)local_30d._597_4_);
              AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>::AlgebraicConstraint
                        ((AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_> *)
                         in_stack_fffffffffffffb38,
                         (LinTerms *)CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                         (AlgConRhs<0>)in_stack_fffffffffffffb40.rhs_,(bool)fSort);
              in_stack_fffffffffffffb28 = local_30d + 0x17d;
              ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>_>::
              ConditionalConstraint(this_00,in_RDI);
              in_stack_fffffffffffffb34 =
                   FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
                   ::
                   AssignResultVar2Args<mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRhs<0>>>>
                             (in_stack_fffffffffffffb38,
                              (ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>_>
                               *)CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30));
              pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                                 (&local_98,local_30d._589_8_);
              *pvVar8 = in_stack_fffffffffffffb34;
              ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>_>::
              ~ConditionalConstraint
                        ((ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>_>
                          *)0x2bc16c);
              AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>::~AlgebraicConstraint
                        ((AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_> *)NVar12.ir_);
              LinTerms::~LinTerms((LinTerms *)NVar12.ir_);
              std::vector<int,_std::allocator<int>_>::~vector
                        ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffb20);
              std::allocator<int>::~allocator((allocator<int> *)0x2bc1a0);
              std::vector<double,_std::allocator<double>_>::~vector
                        ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffb20);
              std::allocator<double>::~allocator((allocator<double> *)0x2bc1ba);
              local_30d._589_8_ = local_30d._589_8_ + 1;
            }
            in_stack_fffffffffffffb20 =
                 (allocator_type *)
                 BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                 ::GetMC((BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                          *)in_RDI);
            LinTerms::LinTerms(in_stack_fffffffffffffb80,c,v_00);
            AlgConRhs<-1>::AlgConRhs(local_438,local_a8);
            AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<-1>_>::AlgebraicConstraint
                      ((AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_> *)
                       in_stack_fffffffffffffb38,
                       (LinTerms *)CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                       in_stack_fffffffffffffb40,SUB81((ulong)in_stack_fffffffffffffb28 >> 0x38,0));
            NVar12 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
                     ::AddConstraint<mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRhs<_1>>>
                               ((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                                 *)in_stack_fffffffffffffb40.rhs_,
                                (AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_> *)
                                in_stack_fffffffffffffb38);
            AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<-1>_>::~AlgebraicConstraint
                      ((AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_> *)NVar12.ir_);
            LinTerms::~LinTerms((LinTerms *)NVar12.ir_);
          }
          std::vector<int,_std::allocator<int>_>::~vector
                    ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffb20);
          std::vector<double,_std::allocator<double>_>::~vector
                    ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffb20);
          return;
        }
      }
      uVar5 = __cxa_allocate_exception(0x18);
      fmt::BasicCStringRef<char>::BasicCStringRef
                (local_50,
                 "MP2MIP: AllDiff on variables with domain out of integer range not implemented");
      Error::Error(in_stack_fffffffffffffb58,in_stack_fffffffffffffb60,in_stack_fffffffffffffb54);
      __cxa_throw(uVar5,&Error::typeinfo,Error::~Error);
    }
  }
  uVar5 = __cxa_allocate_exception(0x18);
  fmt::BasicCStringRef<char>::BasicCStringRef
            (local_38,"MP2MIP: AllDiff on unbounded variables not implemented");
  Error::Error(in_stack_fffffffffffffb58,in_stack_fffffffffffffb60,in_stack_fffffffffffffb54);
  __cxa_throw(uVar5,&Error::typeinfo,Error::~Error);
}

Assistant:

void ConvertCtxPos(const ItemType& alld, int ) {
    const auto& args = alld.GetArguments();
    const auto lba_dbl = GetMC().lb_array(args);
    const auto uba_dbl = GetMC().ub_array(args);
    if (lba_dbl<=GetMC().MinusInfty() ||
        uba_dbl>=GetMC().Infty())
      MP_RAISE("MP2MIP: AllDiff on unbounded variables not implemented");
    if (lba_dbl<std::numeric_limits<int>::min() ||
        uba_dbl>std::numeric_limits<int>::max())
      MP_RAISE("MP2MIP: AllDiff on variables with domain "
               "out of integer range not implemented");
    const int lba = (int)std::round(lba_dbl);
    const int uba = (int)std::round(uba_dbl);
    std::vector<double> coefs(args.size(), 1.0);
    std::vector<int> flags(args.size());        // unary encoding flags
    double rhs = 1.0;
    if (!GetMC().is_fixed(alld.GetResultVar())) {  // implied version: b -> alldiff
      coefs.push_back(args.size()-1.0);
      flags.push_back(alld.GetResultVar());
      rhs = (double)args.size();
    }
    for (int v=lba; v!=uba+1; ++v) {            // for each value in the domain union
      for (size_t ivar = 0; ivar < args.size(); ++ivar) {
        flags[ivar] = GetMC().AssignResultVar2Args(
              CondLinConEQ( { {{1.0}, {args[ivar]}}, double(v) } ) );
      }
      GetMC().AddConstraint( LinConLE( {coefs, flags}, {rhs} ) );
    }
  }